

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_open_w(ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ma_vfs_callbacks *pCallbacks;
  undefined4 local_4;
  
  if (in_RCX == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RCX = 0;
    if (((in_RDI == 0) || (in_RSI == 0)) || (in_EDX == 0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else if (*(long *)(in_RDI + 8) == 0) {
      local_4 = MA_NOT_IMPLEMENTED;
    }
    else {
      local_4 = (**(code **)(in_RDI + 8))(in_RDI,in_RSI,in_EDX,in_RCX);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pVFS == NULL || pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onOpenW == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onOpenW(pVFS, pFilePath, openMode, pFile);
}